

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg.c
# Opt level: O2

TCGOp * tcg_op_alloc(TCGContext_conflict9 *s,TCGOpcode opc)

{
  QTailQLink *pQVar1;
  anon_union_16_2_aaf24f3d_for_link *paVar2;
  TCGOp *pTVar3;
  
  pTVar3 = (s->free_ops).tqh_first;
  if (pTVar3 == (TCGOp *)0x0) {
    pTVar3 = (TCGOp *)tcg_malloc(s,0x78);
  }
  else {
    pQVar1 = (pTVar3->link).tqe_circ.tql_prev;
    paVar2 = &((pTVar3->link).tqe_next)->link;
    if ((pTVar3->link).tqe_next == (TCGOp *)0x0) {
      paVar2 = (anon_union_16_2_aaf24f3d_for_link *)&s->free_ops;
    }
    (paVar2->tqe_circ).tql_prev = pQVar1;
    pQVar1->tql_next = (pTVar3->link).tqe_next;
    (pTVar3->link).tqe_next = (TCGOp *)0x0;
    (pTVar3->link).tqe_circ.tql_prev = (QTailQLink *)0x0;
  }
  *(undefined8 *)pTVar3 = 0;
  *(TCGOpcode *)pTVar3 = opc & (INDEX_op_mulsh_i64|INDEX_op_muluh_i64);
  s->nb_ops = s->nb_ops + 1;
  return pTVar3;
}

Assistant:

static TCGOp *tcg_op_alloc(TCGContext *s, TCGOpcode opc)
{
    TCGOp *op;

    if (likely(QTAILQ_EMPTY(&s->free_ops))) {
        op = tcg_malloc(s, sizeof(TCGOp));
    } else {
        op = QTAILQ_FIRST(&s->free_ops);
        QTAILQ_REMOVE(&s->free_ops, op, link);
    }
    memset(op, 0, offsetof(TCGOp, link));
    op->opc = opc;
    s->nb_ops++;

    return op;
}